

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

string * __thiscall
deqp::gls::DrawTestSpec::usageTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestSpec *this,Usage usage)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             _ZZN4deqp3gls12DrawTestSpec17usageTypeToStringB5cxx11ENS1_5UsageEE6usages_rel +
             *(int *)(_ZZN4deqp3gls12DrawTestSpec17usageTypeToStringB5cxx11ENS1_5UsageEE6usages_rel
                     + (long)(int)this * 4),&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawTestSpec::usageTypeToString(Usage usage)
{
	static const char* usages[] =
	{
		"dynamic_draw",	// USAGE_DYNAMIC_DRAW = 0,
		"static_draw",	// USAGE_STATIC_DRAW,
		"stream_draw",	// USAGE_STREAM_DRAW,

		"stream_read",	// USAGE_STREAM_READ,
		"stream_copy",	// USAGE_STREAM_COPY,

		"static_read",	// USAGE_STATIC_READ,
		"static_copy",	// USAGE_STATIC_COPY,

		"dynamic_read",	// USAGE_DYNAMIC_READ,
		"dynamic_copy",	// USAGE_DYNAMIC_COPY,
	};

	return de::getSizedArrayElement<DrawTestSpec::USAGE_LAST>(usages, (int)usage);
}